

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void LargeIntRegMultiply<unsigned_long,unsigned_int>::
     RegMultiplyThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uint64_t *a,uint32_t b,uint64_t *pRet)

{
  uint uVar1;
  ulong uVar2;
  ulong *in_RDX;
  uint in_ESI;
  ulong *in_RDI;
  uint64_t tmp;
  uint32_t aLow;
  uint32_t aHigh;
  
  uVar1 = (uint)(*in_RDI >> 0x20);
  uVar2 = *in_RDI;
  *in_RDX = 0;
  if (uVar1 == 0) {
    *in_RDX = (uVar2 & 0xffffffff) * (ulong)in_ESI;
  }
  else {
    *in_RDX = (ulong)uVar1 * (ulong)in_ESI;
    if ((int)(*in_RDX >> 0x20) != 0) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    *in_RDX = *in_RDX << 0x20;
    uVar2 = (uVar2 & 0xffffffff) * (ulong)in_ESI;
    *in_RDX = uVar2 + *in_RDX;
    if (*in_RDX < uVar2) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::uint64_t& a, std::uint32_t b, std::uint64_t* pRet ) SAFEINT_CPP_THROW
    {
#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        if( !MultiplyUint64( a, (std::uint64_t)b, pRet ) )
            E::SafeIntOnOverflow();
#else
        std::uint32_t aHigh = 0, aLow = 0;

        // Consider that a*b can be broken up into:
        // (aHigh * 2^32 + aLow) * b
        // => (aHigh * b * 2^32) + (aLow * b)

        aHigh = (std::uint32_t)(a >> 32);
        aLow  = (std::uint32_t)a;

        *pRet = 0;

        if(aHigh != 0)
        {
            *pRet = (std::uint64_t)aHigh * (std::uint64_t)b;

            std::uint64_t tmp = 0;

            if((std::uint32_t)(*pRet >> 32) != 0)
                E::SafeIntOnOverflow();

            *pRet <<= 32;
            tmp = (std::uint64_t)aLow * (std::uint64_t)b;
            *pRet += tmp;

            if(*pRet < tmp)
                E::SafeIntOnOverflow();

            return;
        }

        *pRet = (std::uint64_t)aLow * (std::uint64_t)b;
        return;
#endif
    }